

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenMiniReflect
          (CppGenerator *this,StructDef *struct_def,EnumDef *enum_def)

{
  CodeWriter *pCVar1;
  char cVar2;
  BaseType BVar3;
  pointer ppEVar4;
  pointer ppFVar5;
  FieldDef *pFVar6;
  StructDef *pSVar7;
  EnumDef *pEVar8;
  pointer pcVar9;
  undefined8 uVar10;
  SymbolTable<flatbuffers::EnumVal> *pSVar11;
  SymbolTable<flatbuffers::EnumVal> *pSVar12;
  uint16_t uVar13;
  undefined6 uVar14;
  BaseType BVar15;
  _Alloc_hider __s2;
  size_type __n;
  EnumDef *this_00;
  pointer pbVar16;
  iterator iVar17;
  Type *pTVar18;
  int iVar19;
  mapped_type *pmVar20;
  char *pcVar21;
  size_t sVar22;
  long *plVar23;
  undefined8 *puVar24;
  EnumVal *pEVar25;
  uint64_t uVar26;
  long *plVar27;
  ulong *puVar28;
  size_type *psVar29;
  Value *__args;
  char *__s;
  pointer pbVar30;
  int t;
  ulong uVar31;
  undefined8 uVar32;
  pointer ppFVar33;
  Type *pTVar34;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar35;
  uint uVar36;
  FieldDef **field;
  unsigned_short *puVar37;
  pointer ppEVar38;
  string ts;
  string as;
  string rs;
  string vs;
  string ns;
  vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_refs;
  vector<unsigned_short,_std::allocator<unsigned_short>_> array_sizes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  _Alloc_hider local_4b8;
  undefined2 uStack_4b0;
  undefined6 uStack_4ae;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4a8;
  string local_490;
  string local_470;
  ulong *local_450;
  long local_448;
  ulong local_440;
  long lStack_438;
  string local_430;
  allocator<char> local_409;
  EnumDef *local_408;
  CppGenerator *local_400;
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  long lStack_3e0;
  Type *local_3d8;
  iterator iStack_3d0;
  Type *local_3c8;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  string local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  unsigned_short *local_338;
  iterator iStack_330;
  unsigned_short *local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  CodeWriter *local_318;
  pointer local_310;
  StructDef *local_308;
  Type *local_300;
  string local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  pointer local_2b8;
  pointer local_2b0;
  Type *local_2a8;
  ulong local_2a0;
  ulong local_298;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_4b8._M_p = (pointer)&aStack_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"NAME","");
  pCVar1 = &this->code_;
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,(key_type *)&local_4b8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_p != &aStack_4a8) {
    operator_delete(local_4b8._M_p,
                    CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4a8._M_local_buf[1],aStack_4a8._M_local_buf[0])) + 1);
  }
  local_4b8._M_p = (pointer)&aStack_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"SEQ_TYPE","");
  if (struct_def == (StructDef *)0x0) {
    pcVar21 = "ST_UNION";
    __s = "ST_ENUM";
    cVar2 = enum_def->is_union;
  }
  else {
    pcVar21 = "ST_STRUCT";
    __s = "ST_TABLE";
    cVar2 = struct_def->fixed;
  }
  if (cVar2 != '\0') {
    __s = pcVar21;
  }
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_470._M_dataplus._M_p;
  sVar22 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,__s,__s + sVar22);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,(key_type *)&local_4b8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                             local_470.field_2._M_local_buf[0]) + 1);
  }
  local_400 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_p != &aStack_4a8) {
    operator_delete(local_4b8._M_p,
                    CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4a8._M_local_buf[1],aStack_4a8._M_local_buf[0])) + 1);
  }
  pSVar11 = (SymbolTable<flatbuffers::EnumVal> *)&struct_def->fields;
  pSVar12 = (SymbolTable<flatbuffers::EnumVal> *)&struct_def->fields;
  if (struct_def == (StructDef *)0x0) {
    pSVar11 = &enum_def->vals;
    pSVar12 = &enum_def->vals;
  }
  ppEVar38 = (pSVar12->vec).
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  ppEVar4 = (pSVar11->vec).
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_4b8._M_p = (pointer)&aStack_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"NUM_FIELDS","");
  NumToString<unsigned_long>(&local_470,(long)ppEVar38 - (long)ppEVar4 >> 3);
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,(key_type *)&local_4b8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                             local_470.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_p != &aStack_4a8) {
    operator_delete(local_4b8._M_p,
                    CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4a8._M_local_buf[1],aStack_4a8._M_local_buf[0])) + 1);
  }
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3c8 = (Type *)0x0;
  local_3d8 = (Type *)0x0;
  iStack_3d0._M_current = (Type *)0x0;
  local_408 = enum_def;
  local_318 = pCVar1;
  local_310 = ppEVar4;
  local_308 = struct_def;
  local_2b8 = ppEVar38;
  if (struct_def == (StructDef *)0x0) {
    ppEVar38 = (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar38 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar25 = *ppEVar38;
        EscapeKeyword((string *)&local_4b8,local_400,&pEVar25->name);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_p != &aStack_4a8) {
          operator_delete(local_4b8._M_p,
                          CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,
                                   CONCAT11(aStack_4a8._M_local_buf[1],aStack_4a8._M_local_buf[0]))
                          + 1);
        }
        pTVar34 = &pEVar25->union_type;
        if (local_408->is_union == false) {
          pTVar34 = &enum_def->underlying_type;
        }
        local_4b8._M_p = *(pointer *)pTVar34;
        pSVar7 = pTVar34->struct_def;
        uVar32 = *(undefined8 *)((long)&pTVar34->struct_def + 2);
        uVar10 = *(undefined8 *)((long)&pTVar34->enum_def + 2);
        aStack_4a8._M_local_buf[0] = (char)((ulong)uVar32 >> 0x30);
        aStack_4a8._M_local_buf[1] = (char)((ulong)uVar32 >> 0x38);
        aStack_4a8._M_allocated_capacity._2_6_ = (undefined6)uVar10;
        aStack_4a8._8_2_ = (undefined2)((ulong)uVar10 >> 0x30);
        uStack_4b0 = SUB82(pSVar7,0);
        uStack_4ae = (undefined6)((ulong)pSVar7 >> 0x10);
        if (iStack_3d0._M_current == local_3c8) {
          std::vector<flatbuffers::Type,std::allocator<flatbuffers::Type>>::
          _M_realloc_insert<flatbuffers::Type_const&>
                    ((vector<flatbuffers::Type,std::allocator<flatbuffers::Type>> *)&local_3d8,
                     iStack_3d0,(Type *)&local_4b8);
        }
        else {
          (iStack_3d0._M_current)->enum_def =
               (EnumDef *)
               CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,(short)((ulong)uVar32 >> 0x30));
          *(ulong *)&(iStack_3d0._M_current)->fixed_length =
               CONCAT62(aStack_4a8._10_6_,aStack_4a8._8_2_);
          *(pointer *)iStack_3d0._M_current = local_4b8._M_p;
          (iStack_3d0._M_current)->struct_def = pSVar7;
          iStack_3d0._M_current = iStack_3d0._M_current + 1;
        }
        ppEVar38 = ppEVar38 + 1;
      } while (ppEVar38 !=
               (local_408->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    ppFVar33 = (struct_def->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar5 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar33 != ppFVar5) {
      do {
        Name_abi_cxx11_((string *)&local_4b8,local_400,*ppFVar33);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2d8,
                   (string *)&local_4b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_p != &aStack_4a8) {
          operator_delete(local_4b8._M_p,
                          CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,
                                   CONCAT11(aStack_4a8._M_local_buf[1],aStack_4a8._M_local_buf[0]))
                          + 1);
        }
        pFVar6 = *ppFVar33;
        __args = &pFVar6->value;
        if (iStack_3d0._M_current == local_3c8) {
          std::vector<flatbuffers::Type,std::allocator<flatbuffers::Type>>::
          _M_realloc_insert<flatbuffers::Type_const&>
                    ((vector<flatbuffers::Type,std::allocator<flatbuffers::Type>> *)&local_3d8,
                     iStack_3d0,&__args->type);
        }
        else {
          BVar3 = (__args->type).base_type;
          BVar15 = (__args->type).element;
          pSVar7 = (pFVar6->value).type.struct_def;
          uVar13 = (pFVar6->value).type.fixed_length;
          uVar14 = *(undefined6 *)&(pFVar6->value).type.field_0x1a;
          (iStack_3d0._M_current)->enum_def = (pFVar6->value).type.enum_def;
          (iStack_3d0._M_current)->fixed_length = uVar13;
          *(undefined6 *)&(iStack_3d0._M_current)->field_0x1a = uVar14;
          (iStack_3d0._M_current)->base_type = BVar3;
          (iStack_3d0._M_current)->element = BVar15;
          (iStack_3d0._M_current)->struct_def = pSVar7;
          iStack_3d0._M_current = iStack_3d0._M_current + 1;
        }
        ppFVar33 = ppFVar33 + 1;
      } while (ppFVar33 != ppFVar5);
    }
  }
  local_4b8._M_p = (pointer)&aStack_4a8;
  uStack_4b0 = 0;
  uStack_4ae = 0;
  aStack_4a8._M_local_buf[0] = '\0';
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328 = (unsigned_short *)0x0;
  local_338 = (unsigned_short *)0x0;
  iStack_330._M_current = (unsigned_short *)0x0;
  local_2a8 = iStack_3d0._M_current;
  pTVar34 = local_3d8;
  if (local_3d8 == iStack_3d0._M_current) {
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    local_470._M_string_length = 0;
    local_470.field_2._M_local_buf[0] = '\0';
    local_320 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_470._M_dataplus._M_p;
  }
  else {
    do {
      paVar35 = &local_490.field_2;
      if (CONCAT62(uStack_4ae,uStack_4b0) != 0) {
        std::__cxx11::string::append((char *)&local_4b8);
      }
      BVar3 = pTVar34->base_type;
      local_298 = (ulong)BVar3;
      uVar31 = (ulong)(BVar3 - BASE_TYPE_ARRAY < 2 || BVar3 == BASE_TYPE_VECTOR);
      BVar3 = (&pTVar34->base_type)[uVar31];
      pSVar7 = pTVar34->struct_def;
      if (pSVar7 == (StructDef *)0x0) {
        pEVar8 = pTVar34->enum_def;
        if (pEVar8 != (EnumDef *)0x0) {
          local_490._M_dataplus._M_p = (pointer)paVar35;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
          BaseGenerator::WrapInNameSpace
                    (&local_470,&local_400->super_BaseGenerator,&pEVar8->super_Definition,&local_490
                    );
          goto LAB_0017305e;
        }
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"");
      }
      else {
        local_490._M_dataplus._M_p = (pointer)paVar35;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
        BaseGenerator::WrapInNameSpace
                  (&local_470,&local_400->super_BaseGenerator,&pSVar7->super_Definition,&local_490);
LAB_0017305e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != paVar35) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar16 = local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      __n = local_470._M_string_length;
      __s2._M_p = local_470._M_dataplus._M_p;
      local_300 = pTVar34;
      local_2a0 = uVar31;
      if (local_470._M_string_length == 0) {
        t = -1;
      }
      else {
        local_2b0 = local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pbVar30 = local_378.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_378.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_378.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          t = -1;
LAB_00173106:
          if (pbVar30 != pbVar16) goto LAB_0017312c;
        }
        else {
          t = 0;
          do {
            if ((pbVar30->_M_string_length == __n) &&
               (iVar19 = bcmp((pbVar30->_M_dataplus)._M_p,__s2._M_p,__n), iVar19 == 0))
            goto LAB_00173106;
            pbVar30 = pbVar30 + 1;
            t = t + 1;
          } while (pbVar30 != pbVar16);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_378,&local_470);
        t = (int)((ulong)((long)pbVar16 - (long)local_2b0) >> 5);
      }
LAB_0017312c:
      if ((int)local_298 == 0x11) {
        if (iStack_330._M_current == local_328) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_338,iStack_330,
                     &local_300->fixed_length);
        }
        else {
          *iStack_330._M_current = local_300->fixed_length;
          iStack_330._M_current = iStack_330._M_current + 1;
        }
      }
      uVar36 = BVar3 - BASE_TYPE_UTYPE;
      if (0xc < uVar36) {
        uVar36 = 0xd;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,*(char **)(ElementaryTypeNames()::names + (ulong)uVar36 * 8),
                 &local_409);
      plVar23 = (long *)std::__cxx11::string::replace((ulong)&local_358,0,(char *)0x0,0x36317b);
      plVar27 = plVar23 + 2;
      if ((long *)*plVar23 == plVar27) {
        local_3a8 = *plVar27;
        lStack_3a0 = plVar23[3];
        local_3b8 = &local_3a8;
      }
      else {
        local_3a8 = *plVar27;
        local_3b8 = (long *)*plVar23;
      }
      local_3b0 = plVar23[1];
      *plVar23 = (long)plVar27;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      plVar23 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      puVar28 = (ulong *)(plVar23 + 2);
      if ((ulong *)*plVar23 == puVar28) {
        local_3e8 = *puVar28;
        lStack_3e0 = plVar23[3];
        local_3f8 = &local_3e8;
      }
      else {
        local_3e8 = *puVar28;
        local_3f8 = (ulong *)*plVar23;
      }
      local_3f0 = plVar23[1];
      *plVar23 = (long)puVar28;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      NumToString<bool>(&local_398,SUB81(local_2a0,0));
      uVar31 = 0xf;
      if (local_3f8 != &local_3e8) {
        uVar31 = local_3e8;
      }
      if (uVar31 < local_398._M_string_length + local_3f0) {
        uVar32 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          uVar32 = local_398.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar32 < local_398._M_string_length + local_3f0) goto LAB_00173303;
        puVar24 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,(ulong)local_3f8);
      }
      else {
LAB_00173303:
        puVar24 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3f8,(ulong)local_398._M_dataplus._M_p);
      }
      psVar29 = puVar24 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar29) {
        local_4d8.field_2._M_allocated_capacity = *psVar29;
        local_4d8.field_2._8_8_ = puVar24[3];
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
      }
      else {
        local_4d8.field_2._M_allocated_capacity = *psVar29;
        local_4d8._M_dataplus._M_p = (pointer)*puVar24;
      }
      local_4d8._M_string_length = puVar24[1];
      *puVar24 = psVar29;
      puVar24[1] = 0;
      *(undefined1 *)psVar29 = 0;
      plVar23 = (long *)std::__cxx11::string::append((char *)&local_4d8);
      puVar28 = (ulong *)(plVar23 + 2);
      if ((ulong *)*plVar23 == puVar28) {
        local_440 = *puVar28;
        lStack_438 = plVar23[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *puVar28;
        local_450 = (ulong *)*plVar23;
      }
      local_448 = plVar23[1];
      *plVar23 = (long)puVar28;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      NumToString<int>(&local_2f8,t);
      uVar31 = 0xf;
      if (local_450 != &local_440) {
        uVar31 = local_440;
      }
      if (uVar31 < local_2f8._M_string_length + local_448) {
        uVar32 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          uVar32 = local_2f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar32 < local_2f8._M_string_length + local_448) goto LAB_00173432;
        puVar24 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_450);
      }
      else {
LAB_00173432:
        puVar24 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_450,(ulong)local_2f8._M_dataplus._M_p);
      }
      puVar28 = puVar24 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar24 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar28) {
        local_430.field_2._M_allocated_capacity = *puVar28;
        local_430.field_2._8_8_ = puVar24[3];
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      }
      else {
        local_430.field_2._M_allocated_capacity = *puVar28;
        local_430._M_dataplus._M_p = (pointer)*puVar24;
      }
      local_430._M_string_length = puVar24[1];
      *puVar24 = puVar28;
      puVar24[1] = 0;
      *(undefined1 *)puVar28 = 0;
      plVar23 = (long *)std::__cxx11::string::append((char *)&local_430);
      puVar28 = (ulong *)(plVar23 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar23 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar28) {
        local_490.field_2._M_allocated_capacity = *puVar28;
        local_490.field_2._8_8_ = plVar23[3];
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      }
      else {
        local_490.field_2._M_allocated_capacity = *puVar28;
        local_490._M_dataplus._M_p = (pointer)*plVar23;
      }
      local_490._M_string_length = plVar23[1];
      *plVar23 = (long)puVar28;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_490._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,local_3e8 + 1);
      }
      pTVar18 = local_300;
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8 + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p,
                        CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                                 local_470.field_2._M_local_buf[0]) + 1);
      }
      pbVar16 = local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pTVar34 = pTVar18 + 1;
    } while (pTVar18 + 1 != local_2a8);
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    local_470._M_string_length = 0;
    local_470.field_2._M_local_buf[0] = '\0';
    if (local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar30 = local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (local_470._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_470);
        }
        local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
        pcVar9 = (pbVar30->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_490,pcVar9,pcVar9 + pbVar30->_M_string_length);
        std::__cxx11::string::append((char *)&local_490);
        std::__cxx11::string::_M_append((char *)&local_470,(ulong)local_490._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_490._M_dataplus._M_p != &local_490.field_2) {
          operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
        }
        pbVar30 = pbVar30 + 1;
      } while (pbVar30 != pbVar16);
    }
  }
  iVar17._M_current = iStack_330._M_current;
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490._M_string_length = 0;
  local_490.field_2._M_allocated_capacity =
       local_490.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_338 != iStack_330._M_current) {
    puVar37 = local_338;
    do {
      NumToString<unsigned_short>(&local_430,*puVar37);
      std::__cxx11::string::_M_append((char *)&local_490,(ulong)local_430._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_490);
      puVar37 = puVar37 + 1;
    } while (puVar37 != iVar17._M_current);
  }
  pbVar16 = local_2d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430._M_string_length = 0;
  local_430.field_2._M_allocated_capacity =
       local_430.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar30 = local_2d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_430._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_430);
      }
      std::operator+(&local_4d8,"\"",pbVar30);
      plVar23 = (long *)std::__cxx11::string::append((char *)&local_4d8);
      puVar28 = (ulong *)(plVar23 + 2);
      if ((ulong *)*plVar23 == puVar28) {
        local_440 = *puVar28;
        lStack_438 = plVar23[3];
        local_450 = &local_440;
      }
      else {
        local_440 = *puVar28;
        local_450 = (ulong *)*plVar23;
      }
      local_448 = plVar23[1];
      *plVar23 = (long)puVar28;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_450);
      if (local_450 != &local_440) {
        operator_delete(local_450,local_440 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
      pbVar30 = pbVar30 + 1;
    } while (pbVar30 != pbVar16);
  }
  pSVar7 = local_308;
  pEVar8 = local_408;
  local_450 = &local_440;
  local_448 = 0;
  local_440 = local_440 & 0xffffffffffffff00;
  if ((local_408 == (EnumDef *)0x0) ||
     ((pEVar25 = EnumDef::MinValue(local_408), pEVar25->value == 0 &&
      (ppEVar38 = (pEVar8->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      ppEVar4 = (pEVar8->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, uVar26 = EnumDef::Distance(pEVar8),
      ((long)ppEVar4 - (long)ppEVar38 >> 3) - 1U == uVar26)))) {
    if ((pSVar7 != (StructDef *)0x0) && (pSVar7->fixed == true)) {
      ppFVar33 = (pSVar7->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar5 = (pSVar7->fields).vec.
                super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar33 != ppFVar5) {
        do {
          NumToString<unsigned_short>(&local_4d8,((*ppFVar33)->value).offset);
          std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_4d8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
            operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&local_450);
          ppFVar33 = ppFVar33 + 1;
        } while (ppFVar33 != ppFVar5);
      }
      NumToString<unsigned_long>(&local_4d8,local_308->bytesize);
      std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_4d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
        operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    this_00 = local_408;
    ppEVar38 = (pEVar8->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar38 !=
        (pEVar8->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar25 = *ppEVar38;
        if (local_448 != 0) {
          std::__cxx11::string::append((char *)&local_450);
        }
        EnumDef::ToString_abi_cxx11_(&local_50,this_00,pEVar25);
        NumToStringCpp(&local_4d8,&local_50,(this_00->underlying_type).base_type);
        std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_4d8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppEVar38 = ppEVar38 + 1;
      } while (ppEVar38 !=
               (this_00->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  paVar35 = &local_4d8.field_2;
  local_4d8._M_dataplus._M_p = (pointer)paVar35;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"TYPES","");
  pCVar1 = local_318;
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&local_318->value_map_,&local_4d8);
  ppEVar38 = local_2b8;
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar35) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)paVar35;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"REFS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4d8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar35) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)paVar35;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"ARRAYSIZES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4d8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar35) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)paVar35;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"NAMES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4d8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar35) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_4d8._M_dataplus._M_p = (pointer)paVar35;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"VALUES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pCVar1->value_map_,&local_4d8);
  std::__cxx11::string::_M_assign((string *)pmVar20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar35) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {","");
  CodeWriter::operator+=(pCVar1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (ppEVar38 != local_310) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"  static const ::flatbuffers::TypeCode type_codes[] = {","");
    CodeWriter::operator+=(pCVar1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"    {{TYPES}}","");
    CodeWriter::operator+=(pCVar1,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"  };","");
    CodeWriter::operator+=(pCVar1,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_378.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"  static const ::flatbuffers::TypeFunction type_refs[] = {","");
    CodeWriter::operator+=(pCVar1,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"    {{REFS}}","");
    CodeWriter::operator+=(pCVar1,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"  };","");
    CodeWriter::operator+=(pCVar1,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_490._M_string_length != 0) {
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };","")
    ;
    CodeWriter::operator+=(pCVar1,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_448 != 0) {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"  static const int64_t values[] = { {{VALUES}} };","");
    CodeWriter::operator+=(pCVar1,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_400->opts_).super_IDLOptions.mini_reflect == kTypesAndNames && ppEVar38 != local_310) {
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"  static const char * const names[] = {","");
    CodeWriter::operator+=(pCVar1,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"    {{NAMES}}","");
    CodeWriter::operator+=(pCVar1,&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"  };","");
    CodeWriter::operator+=(pCVar1,&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"  static const ::flatbuffers::TypeTable tt = {","");
  CodeWriter::operator+=(pCVar1,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_398,"    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ","");
  plVar23 = (long *)std::__cxx11::string::append((char *)&local_398);
  local_358 = &local_348;
  plVar27 = plVar23 + 2;
  if ((long *)*plVar23 == plVar27) {
    local_348 = *plVar27;
    lStack_340 = plVar23[3];
  }
  else {
    local_348 = *plVar27;
    local_358 = (long *)*plVar23;
  }
  local_350 = plVar23[1];
  *plVar23 = (long)plVar27;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append((char *)&local_358);
  plVar27 = plVar23 + 2;
  if ((long *)*plVar23 == plVar27) {
    local_3a8 = *plVar27;
    lStack_3a0 = plVar23[3];
    local_3b8 = &local_3a8;
  }
  else {
    local_3a8 = *plVar27;
    local_3b8 = (long *)*plVar23;
  }
  local_3b0 = plVar23[1];
  *plVar23 = (long)plVar27;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append((char *)&local_3b8);
  puVar28 = (ulong *)(plVar23 + 2);
  if ((ulong *)*plVar23 == puVar28) {
    local_3e8 = *puVar28;
    lStack_3e0 = plVar23[3];
    local_3f8 = &local_3e8;
  }
  else {
    local_3e8 = *puVar28;
    local_3f8 = (ulong *)*plVar23;
  }
  local_3f0 = plVar23[1];
  *plVar23 = (long)puVar28;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  psVar29 = (size_type *)(plVar23 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar23 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar29) {
    local_4d8.field_2._M_allocated_capacity = *psVar29;
    local_4d8.field_2._8_8_ = plVar23[3];
    local_4d8._M_dataplus._M_p = (pointer)paVar35;
  }
  else {
    local_4d8.field_2._M_allocated_capacity = *psVar29;
    local_4d8._M_dataplus._M_p = (pointer)*plVar23;
  }
  local_4d8._M_string_length = plVar23[1];
  *plVar23 = (long)psVar29;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  plVar23 = (long *)std::__cxx11::string::append((char *)&local_4d8);
  psVar29 = (size_type *)(plVar23 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar23 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar29) {
    local_290.field_2._M_allocated_capacity = *psVar29;
    local_290.field_2._8_8_ = plVar23[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar29;
    local_290._M_dataplus._M_p = (pointer)*plVar23;
  }
  local_290._M_string_length = plVar23[1];
  *plVar23 = (long)psVar29;
  plVar23[1] = 0;
  *(undefined1 *)(plVar23 + 2) = 0;
  CodeWriter::operator+=(local_318,&local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != paVar35) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,local_3e8 + 1);
  }
  if (local_3b8 != &local_3a8) {
    operator_delete(local_3b8,local_3a8 + 1);
  }
  pCVar1 = local_318;
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"  };","");
  CodeWriter::operator+=(pCVar1,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"  return &tt;","");
  CodeWriter::operator+=(pCVar1,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"}","");
  CodeWriter::operator+=(pCVar1,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  CodeWriter::operator+=(pCVar1,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,local_440 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != local_320) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT71(local_470.field_2._M_allocated_capacity._1_7_,
                             local_470.field_2._M_local_buf[0]) + 1);
  }
  if (local_338 != (unsigned_short *)0x0) {
    operator_delete(local_338,(long)local_328 - (long)local_338);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_p != &aStack_4a8) {
    operator_delete(local_4b8._M_p,
                    CONCAT62(aStack_4a8._M_allocated_capacity._2_6_,
                             CONCAT11(aStack_4a8._M_local_buf[1],aStack_4a8._M_local_buf[0])) + 1);
  }
  if (local_3d8 != (Type *)0x0) {
    operator_delete(local_3d8,(long)local_3c8 - (long)local_3d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  return;
}

Assistant:

void GenMiniReflect(const StructDef *struct_def, const EnumDef *enum_def) {
    code_.SetValue("NAME", struct_def ? struct_def->name : enum_def->name);
    code_.SetValue("SEQ_TYPE",
                   struct_def ? (struct_def->fixed ? "ST_STRUCT" : "ST_TABLE")
                              : (enum_def->is_union ? "ST_UNION" : "ST_ENUM"));
    auto num_fields =
        struct_def ? struct_def->fields.vec.size() : enum_def->size();
    code_.SetValue("NUM_FIELDS", NumToString(num_fields));
    std::vector<std::string> names;
    std::vector<Type> types;

    if (struct_def) {
      for (const auto &field : struct_def->fields.vec) {
        names.push_back(Name(*field));
        types.push_back(field->value.type);
      }
    } else {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        names.push_back(Name(ev));
        types.push_back(enum_def->is_union ? ev.union_type
                                           : Type(enum_def->underlying_type));
      }
    }
    std::string ts;
    std::vector<std::string> type_refs;
    std::vector<uint16_t> array_sizes;
    for (auto &type : types) {
      if (!ts.empty()) ts += ",\n    ";
      auto is_vector = IsVector(type);
      auto is_array = IsArray(type);
      auto bt = is_vector || is_array ? type.element : type.base_type;
      auto et = IsScalar(bt) || bt == BASE_TYPE_STRING
                    ? bt - BASE_TYPE_UTYPE + ET_UTYPE
                    : ET_SEQUENCE;
      int ref_idx = -1;
      std::string ref_name = type.struct_def ? WrapInNameSpace(*type.struct_def)
                             : type.enum_def ? WrapInNameSpace(*type.enum_def)
                                             : "";
      if (!ref_name.empty()) {
        auto rit = type_refs.begin();
        for (; rit != type_refs.end(); ++rit) {
          if (*rit == ref_name) {
            ref_idx = static_cast<int>(rit - type_refs.begin());
            break;
          }
        }
        if (rit == type_refs.end()) {
          ref_idx = static_cast<int>(type_refs.size());
          type_refs.push_back(ref_name);
        }
      }
      if (is_array) { array_sizes.push_back(type.fixed_length); }
      ts += "{ ::flatbuffers::" + std::string(ElementaryTypeNames()[et]) +
            ", " + NumToString(is_vector || is_array) + ", " +
            NumToString(ref_idx) + " }";
    }
    std::string rs;
    for (auto &type_ref : type_refs) {
      if (!rs.empty()) rs += ",\n    ";
      rs += type_ref + "TypeTable";
    }
    std::string as;
    for (auto &array_size : array_sizes) {
      as += NumToString(array_size);
      as += ", ";
    }
    std::string ns;
    for (auto &name : names) {
      if (!ns.empty()) ns += ",\n    ";
      ns += "\"" + name + "\"";
    }
    std::string vs;
    const auto consecutive_enum_from_zero =
        enum_def && enum_def->MinValue()->IsZero() &&
        ((enum_def->size() - 1) == enum_def->Distance());
    if (enum_def && !consecutive_enum_from_zero) {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        if (!vs.empty()) vs += ", ";
        vs += NumToStringCpp(enum_def->ToString(ev),
                             enum_def->underlying_type.base_type);
      }
    } else if (struct_def && struct_def->fixed) {
      for (const auto field : struct_def->fields.vec) {
        vs += NumToString(field->value.offset);
        vs += ", ";
      }
      vs += NumToString(struct_def->bytesize);
    }
    code_.SetValue("TYPES", ts);
    code_.SetValue("REFS", rs);
    code_.SetValue("ARRAYSIZES", as);
    code_.SetValue("NAMES", ns);
    code_.SetValue("VALUES", vs);
    code_ += "inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {";
    if (num_fields) {
      code_ += "  static const ::flatbuffers::TypeCode type_codes[] = {";
      code_ += "    {{TYPES}}";
      code_ += "  };";
    }
    if (!type_refs.empty()) {
      code_ += "  static const ::flatbuffers::TypeFunction type_refs[] = {";
      code_ += "    {{REFS}}";
      code_ += "  };";
    }
    if (!as.empty()) {
      code_ += "  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };";
    }
    if (!vs.empty()) {
      // Problem with uint64_t values greater than 9223372036854775807ULL.
      code_ += "  static const int64_t values[] = { {{VALUES}} };";
    }
    auto has_names =
        num_fields && opts_.mini_reflect == IDLOptions::kTypesAndNames;
    if (has_names) {
      code_ += "  static const char * const names[] = {";
      code_ += "    {{NAMES}}";
      code_ += "  };";
    }
    code_ += "  static const ::flatbuffers::TypeTable tt = {";
    code_ += std::string("    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ") +
             (num_fields ? "type_codes, " : "nullptr, ") +
             (!type_refs.empty() ? "type_refs, " : "nullptr, ") +
             (!as.empty() ? "array_sizes, " : "nullptr, ") +
             (!vs.empty() ? "values, " : "nullptr, ") +
             (has_names ? "names" : "nullptr");
    code_ += "  };";
    code_ += "  return &tt;";
    code_ += "}";
    code_ += "";
  }